

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLDCM.cpp
# Opt level: O0

Matrix33 *
AML::dcmKinematicRates_WorldRates
          (Matrix33 *__return_storage_ptr__,Matrix33 *dcm,Vector3 *worldRates)

{
  undefined1 local_c0 [8];
  Matrix33 skewMatrix;
  double skewMatrixData [9];
  double r;
  double q;
  double p;
  Vector3 *worldRates_local;
  Matrix33 *dcm_local;
  
  skewMatrix.field_0.data[2][2] = 0.0;
  Matrix33::Matrix33((Matrix33 *)local_c0,skewMatrix.field_0.data[2] + 2);
  operator*(__return_storage_ptr__,dcm,(Matrix33 *)local_c0);
  return __return_storage_ptr__;
}

Assistant:

Matrix33 dcmKinematicRates_WorldRates(const Matrix33& dcm, const Vector3& worldRates)
    {
        const double p = worldRates.x;
        const double q = worldRates.y;
        const double r = worldRates.z;
        const double skewMatrixData[9] = { 0.0, -r, q, r, 0.0, -p, -q, p, 0.0 };
        const Matrix33 skewMatrix = Matrix33(skewMatrixData);
        return dcm * skewMatrix;
    }